

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

bstring bfromcstr(char *str)

{
  uint uVar1;
  size_t sVar3;
  bstring __ptr;
  uchar *__dest;
  uint uVar4;
  int iVar2;
  
  if (str != (char *)0x0) {
    sVar3 = strlen(str);
    iVar2 = (int)sVar3;
    uVar1 = iVar2 + 1 + (uint)(sVar3 == 0);
    uVar4 = 8;
    if ((7 < (int)uVar1) &&
       (uVar4 = uVar1 >> 1 | uVar1, uVar4 = uVar4 >> 2 | uVar4, uVar4 = uVar4 >> 4 | uVar4,
       uVar4 = uVar4 >> 8 | uVar4, uVar4 = (uVar4 >> 0x10 | uVar4) + 1, (int)uVar4 <= (int)uVar1)) {
      uVar4 = uVar1;
    }
    if ((iVar2 < (int)uVar4) && (__ptr = (bstring)malloc(0x10), __ptr != (bstring)0x0)) {
      __ptr->slen = iVar2;
      __ptr->mlen = uVar4;
      __dest = (uchar *)malloc((ulong)uVar4);
      __ptr->data = __dest;
      if (__dest != (uchar *)0x0) {
        memcpy(__dest,str,sVar3 + 1);
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (bstring)0x0;
}

Assistant:

bstring bfromcstr (const char * str) {
bstring b;
int i;
size_t j;

	if (str == NULL) return NULL;
	j = (strlen) (str);
	i = snapUpSize ((int) (j + (2 - (j != 0))));
	if (i <= (int) j) return NULL;

	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (NULL == b) return NULL;
	b->slen = (int) j;
	if (NULL == (b->data = (unsigned char *) bstr__alloc (b->mlen = i))) {
		bstr__free (b);
		return NULL;
	}

	bstr__memcpy (b->data, str, j+1);
	return b;
}